

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env_posix.cc
# Opt level: O0

Status __thiscall
leveldb::anon_unknown_1::PosixWritableFile::Append(PosixWritableFile *this,Slice *data)

{
  char *__ptr;
  size_t sVar1;
  size_t sVar2;
  int *piVar3;
  Slice *in_RDX;
  size_t r;
  Slice *data_local;
  PosixWritableFile *this_local;
  
  __ptr = Slice::data(in_RDX);
  sVar1 = Slice::size(in_RDX);
  sVar2 = fwrite_unlocked(__ptr,1,sVar1,(FILE *)data[2].size_);
  sVar1 = Slice::size(in_RDX);
  if (sVar2 == sVar1) {
    Status::OK();
  }
  else {
    piVar3 = __errno_location();
    IOError((anon_unknown_1 *)this,(string *)&data->size_,*piVar3);
  }
  return (Status)(char *)this;
}

Assistant:

virtual Status Append(const Slice &data) {
                size_t r = fwrite_unlocked(data.data(), 1, data.size(), file_);
                if (r != data.size()) {
                    return IOError(filename_, errno);
                }
                return Status::OK();
            }